

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

TPZFMatrix<long> * __thiscall
TPZFMatrix<long>::operator+
          (TPZFMatrix<long> *__return_storage_ptr__,TPZFMatrix<long> *this,long value)

{
  long *plVar1;
  long *plVar2;
  
  TPZFMatrix(__return_storage_ptr__,this);
  plVar2 = __return_storage_ptr__->fElem;
  plVar1 = plVar2 + (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol *
                    (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  for (; plVar2 < plVar1; plVar2 = plVar2 + 1) {
    *plVar2 = *plVar2 + value;
  }
  return __return_storage_ptr__;
}

Assistant:

TPZFMatrix<TVar> TPZFMatrix<TVar>::operator+(const TVar value ) const {
    TPZFMatrix<TVar> res( *this );
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    
    TVar * dst = res.fElem,  *dstlast = dst+size;
    while ( dst < dstlast )
        *dst++ += value;
    
    return( res );
}